

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

FT_Error FT_Outline_Render(FT_Library library,FT_Outline *outline,FT_Raster_Params *params)

{
  int iVar1;
  FT_ListRec *pFVar2;
  FT_Renderer_conflict pFVar3;
  FT_ListNode pFVar4;
  FT_ListNode pFVar5;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (outline == (FT_Outline *)0x0) {
    return 0x14;
  }
  if (params == (FT_Raster_Params *)0x0) {
    iVar1 = 6;
  }
  else {
    pFVar5 = (library->renderers).head;
    pFVar3 = library->cur_renderer;
    params->source = outline;
    if (pFVar3 == (FT_Renderer_conflict)0x0) {
      iVar1 = 0x13;
    }
    else {
      do {
        iVar1 = (*pFVar3->raster_render)(pFVar3->raster,params);
        if (iVar1 == 0) {
          return 0;
        }
        if ((char)iVar1 != '\x13') {
          return iVar1;
        }
        pFVar2 = (FT_ListRec *)&pFVar5->next;
        if (pFVar5 == (FT_ListNode)0x0) {
          pFVar2 = &library->renderers;
        }
        pFVar4 = pFVar2->head;
        while ((pFVar3 = (FT_Renderer_conflict)0x0, pFVar5 = (FT_ListNode)0x0,
               pFVar4 != (FT_ListNode)0x0 &&
               (pFVar3 = (FT_Renderer_conflict)pFVar4->data, pFVar5 = pFVar4,
               pFVar3->glyph_format != FT_GLYPH_FORMAT_OUTLINE))) {
          pFVar4 = pFVar4->next;
        }
      } while (pFVar3 != (FT_Renderer_conflict)0x0);
    }
  }
  return iVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Render( FT_Library         library,
                     FT_Outline*        outline,
                     FT_Raster_Params*  params )
  {
    FT_Error     error;
    FT_Renderer  renderer;
    FT_ListNode  node;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !params )
      return FT_THROW( Invalid_Argument );

    renderer = library->cur_renderer;
    node     = library->renderers.head;

    params->source = (void*)outline;

    error = FT_ERR( Cannot_Render_Glyph );
    while ( renderer )
    {
      error = renderer->raster_render( renderer->raster, params );
      if ( !error || FT_ERR_NEQ( error, Cannot_Render_Glyph ) )
        break;

      /* FT_Err_Cannot_Render_Glyph is returned if the render mode   */
      /* is unsupported by the current renderer for this glyph image */
      /* format                                                      */

      /* now, look for another renderer that supports the same */
      /* format                                                */
      renderer = FT_Lookup_Renderer( library, FT_GLYPH_FORMAT_OUTLINE,
                                     &node );
    }

    return error;
  }